

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_artifact_curse(parser *p)

{
  byte bVar1;
  wchar_t wVar2;
  int iVar3;
  void *pvVar4;
  char *__s1;
  void *pvVar5;
  ulong uVar6;
  char **ppcVar7;
  parser_error pVar8;
  uint uVar9;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"name");
  wVar2 = parser_getint(p,"power");
  if (pvVar4 == (void *)0x0) {
    pVar8 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    bVar1 = z_info->curse_max;
    uVar9 = 1;
    if (1 < bVar1) {
      uVar9 = (uint)bVar1;
    }
    ppcVar7 = &curses[1].name;
    for (uVar6 = 1; uVar6 < bVar1; uVar6 = uVar6 + 1) {
      iVar3 = strcmp(__s1,*ppcVar7);
      if (iVar3 == 0) {
        uVar9 = (uint)uVar6;
        break;
      }
      ppcVar7 = ppcVar7 + 7;
    }
    if (uVar9 == bVar1) {
      pVar8 = PARSE_ERROR_UNRECOGNISED_CURSE;
    }
    else {
      pVar8 = PARSE_ERROR_NONE;
      if (L'\0' < wVar2) {
        pvVar5 = *(void **)((long)pvVar4 + 0xe8);
        if (pvVar5 == (void *)0x0) {
          pvVar5 = mem_zalloc((ulong)((uint)bVar1 * 4));
          *(void **)((long)pvVar4 + 0xe8) = pvVar5;
        }
        *(wchar_t *)((long)pvVar5 + (ulong)uVar9 * 4) = wVar2;
        pVar8 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar8;
}

Assistant:

static enum parser_error parse_artifact_curse(struct parser *p) {
	struct artifact *a = parser_priv(p);
	const char *s = parser_getsym(p, "name");
	int power = parser_getint(p, "power");
	int i;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	for (i = 1; i < z_info->curse_max; i++) {
		if (streq(s, curses[i].name)) break;
	}
	if (i == z_info->curse_max) {
		return PARSE_ERROR_UNRECOGNISED_CURSE;
	}
	/* Only add if it has power. */
	if (power > 0) {
		if (!a->curses) {
			a->curses = mem_zalloc(z_info->curse_max * sizeof(int));
		}
		a->curses[i] = power;
	}
	return PARSE_ERROR_NONE;
}